

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::api::anon_unknown_1::createSingleTest<vkt::api::(anonymous_namespace)::Instance>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,undefined8 param_3,
          Parameters *param_4)

{
  Resources *extraout_RDX;
  string local_88;
  RefBase<vk::VkInstance_s_*> local_68;
  Environment env;
  
  Environment::Environment(&env,(Context *)this,1);
  Instance::create((Move<vk::VkInstance_s_*> *)&local_68,&env,extraout_RDX,param_4);
  local_88.field_2._M_allocated_capacity = (size_type)local_68.m_data.deleter.m_allocator;
  local_88._M_dataplus._M_p = (pointer)local_68.m_data.object;
  local_88._M_string_length = (size_type)local_68.m_data.deleter.m_destroyInstance;
  local_68.m_data.object = (VkInstance_s *)0x0;
  local_68.m_data.deleter.m_destroyInstance = (DestroyInstanceFunc)0x0;
  local_68.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::VkInstance_s_*>::~RefBase(&local_68);
  ::vk::refdetails::RefBase<vk::VkInstance_s_*>::~RefBase((RefBase<vk::VkInstance_s_*> *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"Ok",(allocator<char> *)&local_68);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 1u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}